

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O2

int yin_print_model_(lyout *out,int level,lys_module *module)

{
  lys_ext *plVar1;
  lys_feature *plVar2;
  lys_ident *plVar3;
  lys_node *plVar4;
  lys_deviation *plVar5;
  uint uVar6;
  byte bVar7;
  int iVar8;
  int extraout_EAX;
  lys_import *plVar9;
  lys_include *plVar10;
  lys_module *plVar11;
  lys_module *plVar12;
  lys_deviate *plVar13;
  lys_ext_instance **pplVar14;
  long lVar15;
  char *pcVar16;
  uint ext_size;
  int iVar17;
  ulong uVar18;
  lyout *plVar19;
  ulong uVar20;
  ulong uVar21;
  lys_node **pplVar22;
  undefined8 local_60;
  int close;
  undefined4 uStack_54;
  int local_4c;
  lyout *plStack_48;
  int content;
  lys_module *local_40;
  int local_34;
  
  bVar7 = module->field_0x40;
  if ((bVar7 & 0x30) == 0x10) {
    ly_print(out,"<!-- DEVIATED -->\n");
    bVar7 = module->field_0x40;
  }
  uVar6 = level * 2;
  iVar17 = level + 1;
  plStack_48 = out;
  local_40 = module;
  local_34 = iVar17;
  if ((bVar7 & 1) == 0) {
    ly_print(out,"%*s<module name=\"%s\"\n",(ulong)uVar6,"",module->name);
    yin_print_xmlns(out,module);
    ly_print(out,">\n");
    bVar7 = (byte)module->field_0x40 >> 1 & 7;
    if (bVar7 != 0) {
      pcVar16 = "1";
      if (bVar7 == 2) {
        pcVar16 = "1.1";
      }
      yin_print_substmt(out,iVar17,LYEXT_SUBSTMT_VERSION,'\0',pcVar16,module,module->ext,
                        (uint)module->ext_size);
    }
    yin_print_substmt(out,iVar17,LYEXT_SUBSTMT_NAMESPACE,'\0',module->ns,module,module->ext,
                      (uint)module->ext_size);
    yin_print_substmt(out,iVar17,LYEXT_SUBSTMT_PREFIX,'\0',module->prefix,module,module->ext,
                      (uint)module->ext_size);
  }
  else {
    ly_print(out,"%*s<submodule name=\"%s\"\n",(ulong)uVar6,"",module->name);
    yin_print_xmlns(out,module);
    ly_print(out,">\n");
    plVar11 = lys_main_module(module);
    if (((plVar11->field_0x40 & 0xc) != 0) ||
       (iVar8 = lys_ext_iter(module->ext,module->ext_size,'\0',LYEXT_SUBSTMT_VERSION), iVar8 != -1))
    {
      pcVar16 = "1";
      if (((ulong)module->data->parent & 0xe) == 4) {
        pcVar16 = "1.1";
      }
      yin_print_substmt(out,iVar17,LYEXT_SUBSTMT_VERSION,'\0',pcVar16,module,module->ext,
                        (uint)module->ext_size);
    }
    iVar8 = -1;
    yin_print_open(out,iVar17,(char *)0x0,"belongs-to","module",module->data->dsc,1);
    while (iVar8 = lys_ext_iter(module->ext,module->ext_size,(char)iVar8 + '\x01',
                                LYEXT_SUBSTMT_BELONGSTO), plVar19 = plStack_48, iVar8 != -1) {
      yin_print_extension_instances
                (plStack_48,level + 2,module,LYEXT_SUBSTMT_BELONGSTO,'\0',module->ext + iVar8,1);
    }
    yin_print_substmt(plStack_48,level + 2,LYEXT_SUBSTMT_PREFIX,'\0',module->prefix,module,
                      module->ext,(uint)module->ext_size);
    yin_print_close(plVar19,local_34,(char *)0x0,"belongs-to",1);
  }
  plVar11 = local_40;
  plVar19 = plStack_48;
  iVar17 = level + 2;
  lVar15 = 0;
  for (uVar20 = 0; uVar20 < plVar11->imp_size; uVar20 = uVar20 + 1) {
    yin_print_open(plVar19,local_34,(char *)0x0,"import","module",
                   *(char **)(*(long *)(plVar11->imp->rev + lVar15 + -0x10) + 8),1);
    yin_print_extension_instances
              (plVar19,iVar17,plVar11,LYEXT_SUBSTMT_SELF,'\0',
               *(lys_ext_instance ***)(plVar11->imp->rev + lVar15 + 0x10),
               (uint)(byte)plVar11->imp->rev[lVar15 + 0xb]);
    plVar9 = plVar11->imp;
    yin_print_substmt(plVar19,iVar17,LYEXT_SUBSTMT_PREFIX,'\0',*(char **)(plVar9->rev + lVar15 + -8)
                      ,plVar11,*(lys_ext_instance ***)(plVar9->rev + lVar15 + 0x10),
                      (uint)(byte)plVar9->rev[lVar15 + 0xb]);
    plVar9 = plVar11->imp;
    if (plVar9->rev[lVar15] != '\0') {
      yin_print_substmt(plVar19,iVar17,LYEXT_SUBSTMT_REVISIONDATE,'\0',plVar9->rev + lVar15,plVar11,
                        *(lys_ext_instance ***)(plVar9->rev + lVar15 + 0x10),
                        (uint)(byte)plVar9->rev[lVar15 + 0xb]);
      plVar9 = plVar11->imp;
    }
    yin_print_substmt(plVar19,iVar17,LYEXT_SUBSTMT_DESCRIPTION,'\0',
                      *(char **)(plVar9->rev + lVar15 + 0x18),plVar11,
                      *(lys_ext_instance ***)(plVar9->rev + lVar15 + 0x10),
                      (uint)(byte)plVar9->rev[lVar15 + 0xb]);
    plVar9 = plVar11->imp;
    yin_print_substmt(plVar19,iVar17,LYEXT_SUBSTMT_REFERENCE,'\0',
                      *(char **)(plVar9->rev + lVar15 + 0x20),plVar11,
                      *(lys_ext_instance ***)(plVar9->rev + lVar15 + 0x10),
                      (uint)(byte)plVar9->rev[lVar15 + 0xb]);
    yin_print_close(plVar19,local_34,(char *)0x0,"import",1);
    lVar15 = lVar15 + 0x38;
  }
  lVar15 = 0x18;
  iVar8 = local_34;
  for (uVar20 = 0; plVar11 = local_40, plVar19 = plStack_48, uVar20 < local_40->inc_size;
      uVar20 = uVar20 + 1) {
    plVar10 = local_40->inc;
    if ((((plVar10->rev[lVar15 + -0x18] == '\0') && (*(long *)(plVar10->rev + lVar15) == 0)) &&
        (*(long *)(plVar10->rev + lVar15 + 8) == 0)) && (plVar10->rev[lVar15 + -0xd] == '\0')) {
      yin_print_open(plStack_48,iVar8,(char *)0x0,"include","module",
                     *(char **)(*(long *)(plVar10->rev + lVar15 + -0x20) + 8),-1);
    }
    else {
      _close = uVar20;
      yin_print_open(plStack_48,iVar8,(char *)0x0,"include","module",
                     *(char **)(*(long *)(plVar10->rev + lVar15 + -0x20) + 8),1);
      plVar11 = local_40;
      yin_print_extension_instances
                (plVar19,iVar17,local_40,LYEXT_SUBSTMT_SELF,'\0',
                 *(lys_ext_instance ***)(local_40->inc->rev + lVar15 + -8),
                 (uint)(byte)local_40->inc->rev[lVar15 + -0xd]);
      plVar10 = plVar11->inc;
      if (plVar10->rev[lVar15 + -0x18] != '\0') {
        pcVar16 = plVar10->rev + lVar15 + -8;
        yin_print_substmt(plVar19,iVar17,LYEXT_SUBSTMT_REVISIONDATE,'\0',pcVar16 + -0x10,plVar11,
                          *(lys_ext_instance ***)pcVar16,(uint)(byte)pcVar16[-5]);
        plVar10 = plVar11->inc;
      }
      yin_print_substmt(plVar19,iVar17,LYEXT_SUBSTMT_DESCRIPTION,'\0',
                        *(char **)(plVar10->rev + lVar15),plVar11,
                        *(lys_ext_instance ***)(plVar10->rev + lVar15 + -8),
                        (uint)(byte)plVar10->rev[lVar15 + -0xd]);
      plVar10 = plVar11->inc;
      yin_print_substmt(plVar19,iVar17,LYEXT_SUBSTMT_REFERENCE,'\0',
                        *(char **)(plVar10->rev + lVar15 + 8),plVar11,
                        *(lys_ext_instance ***)(plVar10->rev + lVar15 + -8),
                        (uint)(byte)plVar10->rev[lVar15 + -0xd]);
      iVar8 = local_34;
      yin_print_close(plVar19,local_34,(char *)0x0,"include",1);
      uVar20 = _close;
    }
    lVar15 = lVar15 + 0x30;
  }
  lVar15 = 0;
  yin_print_substmt(plStack_48,iVar8,LYEXT_SUBSTMT_ORGANIZATION,'\0',local_40->org,local_40,
                    local_40->ext,(uint)local_40->ext_size);
  yin_print_substmt(plVar19,iVar8,LYEXT_SUBSTMT_CONTACT,'\0',plVar11->contact,plVar11,plVar11->ext,
                    (uint)plVar11->ext_size);
  yin_print_substmt(plVar19,iVar8,LYEXT_SUBSTMT_DESCRIPTION,'\0',plVar11->dsc,plVar11,plVar11->ext,
                    (uint)plVar11->ext_size);
  yin_print_substmt(plVar19,iVar8,LYEXT_SUBSTMT_REFERENCE,'\0',plVar11->ref,plVar11,plVar11->ext,
                    (uint)plVar11->ext_size);
  for (uVar20 = 0; uVar20 < plVar11->rev_size; uVar20 = uVar20 + 1) {
    yin_print_revision(plVar19,iVar8,plVar11,(lys_revision *)(plVar11->rev->date + lVar15));
    lVar15 = lVar15 + 0x28;
  }
  _close = CONCAT44(uStack_54,level + 3);
  for (uVar20 = 0; plVar19 = plStack_48, uVar20 < plVar11->extensions_size; uVar20 = uVar20 + 1) {
    plVar1 = plVar11->extensions;
    plVar4 = (lys_node *)(plVar1 + uVar20);
    local_60._0_4_ = 0;
    local_4c = 0;
    yin_print_open(plStack_48,local_34,(char *)0x0,"extension","name",plVar1[uVar20].name,0);
    yin_print_snode_common(plVar19,iVar17,plVar4,plVar1[uVar20].module,(int *)&local_60,1);
    if (plVar1[uVar20].argument != (char *)0x0) {
      yin_print_close_parent(plVar19,(int *)&local_60);
      yin_print_open(plVar19,iVar17,(char *)0x0,"argument","name",(char *)plVar4->iffeature,local_4c
                    );
      iVar8 = -1;
      while (iVar8 = lys_ext_iter(plVar4->ext,plVar4->ext_size,(char)iVar8 + '\x01',
                                  LYEXT_SUBSTMT_ARGUMENT), iVar8 != -1) {
        yin_print_close_parent(plVar19,&local_4c);
        yin_print_extension_instances
                  (plVar19,close,plVar4->module,LYEXT_SUBSTMT_ARGUMENT,'\0',plVar4->ext + iVar8,1);
      }
      if (((plVar4->flags & 1) != 0) ||
         (iVar8 = lys_ext_iter(plVar4->ext,plVar4->ext_size,'\0',LYEXT_SUBSTMT_YINELEM), iVar8 != -1
         )) {
        yin_print_close_parent(plVar19,&local_4c);
        pcVar16 = "true";
        if ((plVar4->flags & 1) == 0) {
          pcVar16 = "false";
        }
        yin_print_substmt(plVar19,close,LYEXT_SUBSTMT_YINELEM,'\0',pcVar16,plVar4->module,
                          plVar4->ext,(uint)plVar4->ext_size);
      }
      yin_print_close(plVar19,iVar17,(char *)0x0,"argument",local_4c);
    }
    yin_print_snode_common(plVar19,iVar17,plVar4,plVar4->module,(int *)&local_60,0x70);
    yin_print_close(plVar19,local_34,(char *)0x0,"extension",(int)local_60);
    plVar11 = local_40;
  }
  if (plVar11->ext_size != 0) {
    yin_print_extension_instances
              (plStack_48,local_34,plVar11,LYEXT_SUBSTMT_SELF,'\0',plVar11->ext,
               (uint)plVar11->ext_size);
  }
  iVar8 = local_34;
  lVar15 = 0;
  for (uVar20 = 0; plVar19 = plStack_48, uVar20 < plVar11->features_size; uVar20 = uVar20 + 1) {
    plVar2 = plVar11->features;
    local_60._0_4_ = 0;
    yin_print_open(plStack_48,iVar8,(char *)0x0,"feature","name",
                   *(char **)(plVar2->padding + lVar15 + -0x1c),0);
    yin_print_snode_common
              (plVar19,iVar17,(lys_node *)(plVar2->padding + lVar15 + -0x1c),
               *(lys_module **)(plVar2->padding + lVar15 + 0x14),(int *)&local_60,0x73);
    plVar11 = local_40;
    yin_print_close(plVar19,iVar8,(char *)0x0,"feature",(int)local_60);
    lVar15 = lVar15 + 0x40;
  }
  for (uVar20 = 0; iVar8 = local_34, uVar20 < plVar11->ident_size; uVar20 = uVar20 + 1) {
    plVar3 = plVar11->ident;
    plVar4 = (lys_node *)(plVar3 + uVar20);
    local_4c = 0;
    yin_print_open(plVar19,local_34,(char *)0x0,"identity","name",plVar3[uVar20].name,0);
    yin_print_snode_common(plVar19,iVar17,plVar4,plVar3[uVar20].module,&local_4c,3);
    for (uVar21 = 0; uVar21 < plVar4->padding[3]; uVar21 = uVar21 + 1) {
      yin_print_close_parent(plVar19,&local_4c);
      plVar11 = lys_main_module(*(lys_module **)
                                 (*(long *)(*(long *)&plVar4->nodetype + uVar21 * 8) + 0x30));
      plVar12 = lys_main_module(plVar4->module);
      if (plVar12 == plVar11) {
        yin_print_substmt(plVar19,iVar17,LYEXT_SUBSTMT_BASE,(uint8_t)uVar21,
                          (char *)**(undefined8 **)(*(long *)&plVar4->nodetype + uVar21 * 8),
                          plVar4->module,plVar4->ext,(uint)plVar4->ext_size);
      }
      else {
        pcVar16 = transform_module_name2import_prefix(plVar4->module,plVar11->name);
        asprintf((char **)&local_60,"%s:%s",pcVar16,
                 **(undefined8 **)(*(long *)&plVar4->nodetype + uVar21 * 8));
        yin_print_substmt(plVar19,iVar17,LYEXT_SUBSTMT_BASE,(uint8_t)uVar21,
                          (char *)CONCAT44(local_60._4_4_,(int)local_60),plVar4->module,plVar4->ext,
                          (uint)plVar4->ext_size);
        free((void *)CONCAT44(local_60._4_4_,(int)local_60));
      }
    }
    yin_print_snode_common(plVar19,iVar17,plVar4,plVar4->module,&local_4c,0x70);
    yin_print_close(plVar19,local_34,(char *)0x0,"identity",local_4c);
    plVar11 = local_40;
  }
  lVar15 = 0;
  for (uVar20 = 0; uVar20 < plVar11->tpdf_size; uVar20 = uVar20 + 1) {
    yin_print_typedef(plVar19,iVar8,plVar11,(lys_tpdf *)(plVar11->tpdf->padding + lVar15 + -0x1c));
    lVar15 = lVar15 + 0x80;
  }
  plVar11 = lys_main_module(plVar11);
  pplVar22 = &plVar11->data;
  while (plVar4 = *pplVar22, plVar4 != (lys_node *)0x0) {
    if (plVar4->module == local_40) {
      yin_print_snode(plVar19,iVar8,plVar4,0x800);
    }
    pplVar22 = &plVar4->next;
  }
  plVar11 = lys_main_module(local_40);
  pplVar22 = &plVar11->data;
  while (plVar11 = local_40, plVar4 = *pplVar22, plVar4 != (lys_node *)0x0) {
    if (plVar4->module == local_40) {
      yin_print_snode(plVar19,iVar8,plVar4,0x903f);
    }
    pplVar22 = &plVar4->next;
  }
  lVar15 = 0;
  for (uVar20 = 0; uVar20 < plVar11->augment_size; uVar20 = uVar20 + 1) {
    yin_print_augment(plVar19,iVar8,plVar11,
                      (lys_node_augment *)(plVar11->augment->padding + lVar15 + -0x1c));
    lVar15 = lVar15 + 0x68;
  }
  plVar11 = lys_main_module(plVar11);
  pplVar22 = &plVar11->data;
  while (plVar4 = *pplVar22, plVar4 != (lys_node *)0x0) {
    if (plVar4->module == local_40) {
      yin_print_snode(plVar19,iVar8,plVar4,0x4100);
    }
    pplVar22 = &plVar4->next;
  }
  plVar11 = lys_main_module(local_40);
  pplVar22 = &plVar11->data;
  while (plVar4 = *pplVar22, plVar4 != (lys_node *)0x0) {
    if (plVar4->module == local_40) {
      yin_print_snode(plVar19,iVar8,plVar4,0x80);
    }
    pplVar22 = &plVar4->next;
  }
  uVar20 = 0;
  do {
    plVar19 = plStack_48;
    if (local_40->deviation_size <= uVar20) {
      pcVar16 = "%*s</submodule>\n";
      if ((local_40->field_0x40 & 1) == 0) {
        pcVar16 = "%*s</module>\n";
      }
      ly_print(plStack_48,pcVar16,(ulong)uVar6,"");
      ly_print_flush(plVar19);
      return extraout_EAX;
    }
    plVar5 = local_40->deviation;
    pcVar16 = transform_json2schema(local_40,plVar5[uVar20].target_name);
    yin_print_open(plStack_48,local_34,(char *)0x0,"deviation","target-node",pcVar16,1);
    plVar11 = local_40;
    lydict_remove(local_40->ctx,pcVar16);
    plVar19 = plStack_48;
    ext_size = 0;
    if (plVar5[uVar20].ext_size != 0) {
      yin_print_extension_instances
                (plStack_48,iVar17,plVar11,LYEXT_SUBSTMT_SELF,'\0',plVar5[uVar20].ext,
                 (uint)plVar5[uVar20].ext_size);
      ext_size = (uint)plVar5[uVar20].ext_size;
    }
    yin_print_substmt(plVar19,iVar17,LYEXT_SUBSTMT_DESCRIPTION,'\0',plVar5[uVar20].dsc,plVar11,
                      plVar5[uVar20].ext,ext_size);
    yin_print_substmt(plVar19,iVar17,LYEXT_SUBSTMT_REFERENCE,'\0',plVar5[uVar20].ref,plVar11,
                      plVar5[uVar20].ext,(uint)plVar5[uVar20].ext_size);
    for (uVar21 = 0; uVar21 < plVar5[uVar20].deviate_size; uVar21 = uVar21 + 1) {
      ly_print(plVar19,"%*s<deviate value=",(ulong)(uint)(iVar17 * 2),"");
      pcVar16 = "\"add\">\n";
      switch(plVar5[uVar20].deviate[uVar21].mod) {
      case LY_DEVIATE_NO:
        pcVar16 = "\"not-supported\">\n";
        if (plVar5[uVar20].deviate[uVar21].ext_size != '\0') break;
        ly_print(plVar19,"\"not-supported\"/>\n");
        goto LAB_001718b3;
      case LY_DEVIATE_ADD:
        break;
      case LY_DEVIATE_RPL:
        pcVar16 = "\"replace\">\n";
        break;
      case LY_DEVIATE_DEL:
        pcVar16 = "\"delete\">\n";
        break;
      default:
        goto switchD_00171520_default;
      }
      ly_print(plVar19,pcVar16);
switchD_00171520_default:
      plVar13 = plVar5[uVar20].deviate;
      if (plVar13[uVar21].ext_size != 0) {
        yin_print_extension_instances
                  (plVar19,close,local_40,LYEXT_SUBSTMT_SELF,'\0',plVar13[uVar21].ext,
                   (uint)plVar13[uVar21].ext_size);
        plVar13 = plVar5[uVar20].deviate;
      }
      iVar8 = close;
      if (plVar13[uVar21].type != (lys_type *)0x0) {
        yin_print_type(plVar19,close,local_40,plVar13[uVar21].type);
        plVar13 = plVar5[uVar20].deviate;
      }
      yin_print_substmt(plVar19,iVar8,LYEXT_SUBSTMT_UNITS,'\0',plVar13[uVar21].units,local_40,
                        plVar13[uVar21].ext,(uint)plVar13[uVar21].ext_size);
      lVar15 = 0;
      uVar18 = 0;
      while( true ) {
        plVar13 = plVar5[uVar20].deviate;
        if (plVar13[uVar21].must_size <= uVar18) break;
        yin_print_must(plStack_48,close,local_40,
                       (lys_restr *)((long)&(plVar13[uVar21].must)->expr + lVar15));
        uVar18 = uVar18 + 1;
        lVar15 = lVar15 + 0x38;
      }
      iVar8 = close;
      for (uVar18 = 0; plVar19 = plStack_48, uVar18 < plVar13[uVar21].unique_size;
          uVar18 = uVar18 + 1) {
        yin_print_unique(plStack_48,iVar8,plVar13[uVar21].unique + uVar18);
        local_60._0_4_ = 0;
        plVar13 = plVar5[uVar20].deviate;
        iVar8 = -1;
        while (iVar8 = lys_ext_iter(plVar13[uVar21].ext,plVar13[uVar21].ext_size,
                                    (char)iVar8 + '\x01',LYEXT_SUBSTMT_UNIQUE), iVar8 != -1) {
          plVar13 = plVar5[uVar20].deviate;
          if (uVar18 == plVar13[uVar21].ext[iVar8]->insubstmt_index) {
            yin_print_close_parent(plStack_48,(int *)&local_60);
            pplVar14 = plVar5[uVar20].deviate[uVar21].ext;
            do {
              yin_print_extension_instances
                        (plStack_48,level + 4,local_40,LYEXT_SUBSTMT_UNIQUE,(uint8_t)uVar18,
                         pplVar14 + iVar8,1);
              plVar13 = plVar5[uVar20].deviate;
              do {
                iVar8 = lys_ext_iter(plVar13[uVar21].ext,plVar13[uVar21].ext_size,
                                     (char)iVar8 + '\x01',LYEXT_SUBSTMT_UNIQUE);
                if (iVar8 == -1) goto LAB_00171716;
                plVar13 = plVar5[uVar20].deviate;
                pplVar14 = plVar13[uVar21].ext;
              } while (uVar18 != pplVar14[iVar8]->insubstmt_index);
            } while( true );
          }
        }
LAB_00171716:
        iVar8 = close;
        yin_print_close(plStack_48,close,(char *)0x0,"unique",(int)local_60);
        plVar13 = plVar5[uVar20].deviate;
      }
      uVar18 = 0;
      while( true ) {
        if (plVar13[uVar21].dflt_size <= uVar18) break;
        yin_print_substmt(plVar19,close,LYEXT_SUBSTMT_DEFAULT,(uint8_t)uVar18,
                          plVar13[uVar21].dflt[uVar18],local_40,plVar13[uVar21].ext,
                          (uint)plVar13[uVar21].ext_size);
        uVar18 = uVar18 + 1;
        plVar13 = plVar5[uVar20].deviate;
      }
      pcVar16 = "true";
      if (((plVar13[uVar21].flags & 1) != 0) ||
         (pcVar16 = "false", (plVar13[uVar21].flags & 2) != 0)) {
        yin_print_substmt(plVar19,close,LYEXT_SUBSTMT_CONFIG,'\0',pcVar16,local_40,plVar13->ext,
                          (uint)plVar13[uVar21].ext_size);
      }
      plVar13 = plVar5[uVar20].deviate;
      pcVar16 = "true";
      if (((plVar13[uVar21].flags & 0x40) != 0) ||
         (pcVar16 = "false", (char)plVar13[uVar21].flags < '\0')) {
        yin_print_substmt(plVar19,close,LYEXT_SUBSTMT_MANDATORY,'\0',pcVar16,local_40,
                          plVar13[uVar21].ext,(uint)plVar13[uVar21].ext_size);
      }
      plVar13 = plVar5[uVar20].deviate;
      if (plVar13[uVar21].min_set != '\0') {
        yin_print_unsigned(plVar19,close,LYEXT_SUBSTMT_MIN,'\0',local_40,plVar13[uVar21].ext,
                           (uint)plVar13[uVar21].ext_size,plVar13[uVar21].min);
        plVar13 = plVar5[uVar20].deviate;
      }
      if (plVar13[uVar21].max_set != '\0') {
        if (plVar13[uVar21].max == 0) {
          yin_print_substmt(plVar19,close,LYEXT_SUBSTMT_MAX,'\0',"unbounded",local_40,
                            plVar13[uVar21].ext,(uint)plVar13[uVar21].ext_size);
        }
        else {
          yin_print_unsigned(plVar19,close,LYEXT_SUBSTMT_MAX,'\0',local_40,plVar13[uVar21].ext,
                             (uint)plVar13[uVar21].ext_size,plVar13[uVar21].max);
        }
      }
      yin_print_close(plVar19,iVar17,(char *)0x0,"deviate",1);
LAB_001718b3:
    }
    yin_print_close(plVar19,local_34,(char *)0x0,"deviation",1);
    uVar20 = uVar20 + 1;
  } while( true );
}

Assistant:

static int
yin_print_model_(struct lyout *out, int level, const struct lys_module *module)
{
    unsigned int i;
    int p;
    struct lys_node *node;

    if (module->deviated == 1) {
        ly_print(out, "<!-- DEVIATED -->\n");
    }

    /* (sub)module-header-stmts */
    if (module->type) {
        ly_print(out, "%*s<submodule name=\"%s\"\n", LEVEL, INDENT, module->name);
        yin_print_xmlns(out, module);
        ly_print(out, ">\n");

        level++;
        if (lys_main_module(module)->version > 1 ||
                lys_ext_iter(module->ext, module->ext_size, 0, LYEXT_SUBSTMT_VERSION) != -1) {
            yin_print_substmt(out, level, LYEXT_SUBSTMT_VERSION, 0,
                              ((struct lys_submodule *)module)->belongsto->version == 2 ? "1.1" : "1",
                              module, module->ext, module->ext_size);
        }
        yin_print_open(out, level, NULL, "belongs-to", "module", ((struct lys_submodule *)module)->belongsto->name, 1);
        p = -1;
        while ((p = lys_ext_iter(module->ext, module->ext_size, p + 1, LYEXT_SUBSTMT_BELONGSTO)) != -1) {
            yin_print_extension_instances(out, level + 1, module, LYEXT_SUBSTMT_BELONGSTO, 0, &module->ext[p], 1);
        }
        yin_print_substmt(out, level + 1, LYEXT_SUBSTMT_PREFIX, 0, module->prefix,
                          module, module->ext, module->ext_size);
        yin_print_close(out, level, NULL, "belongs-to", 1);
    } else {
        ly_print(out, "%*s<module name=\"%s\"\n", LEVEL, INDENT, module->name);
        yin_print_xmlns(out, module);
        ly_print(out, ">\n");

        level++;
        if (module->version) {
            yin_print_substmt(out, level, LYEXT_SUBSTMT_VERSION, 0, module->version == 2 ? "1.1" : "1",
                              module, module->ext, module->ext_size);
        }
        yin_print_substmt(out, level, LYEXT_SUBSTMT_NAMESPACE, 0, module->ns,
                          module, module->ext, module->ext_size);
        yin_print_substmt(out, level, LYEXT_SUBSTMT_PREFIX, 0, module->prefix,
                           module, module->ext, module->ext_size);
    }

    /* linkage-stmts */
    for (i = 0; i < module->imp_size; i++) {
        yin_print_open(out, level, NULL, "import", "module", module->imp[i].module->name, 1);
        level++;

        yin_print_extension_instances(out, level, module, LYEXT_SUBSTMT_SELF, 0,
                                       module->imp[i].ext, module->imp[i].ext_size);
        yin_print_substmt(out, level, LYEXT_SUBSTMT_PREFIX, 0, module->imp[i].prefix,
                          module, module->imp[i].ext, module->imp[i].ext_size);
        if (module->imp[i].rev[0]) {
            yin_print_substmt(out, level, LYEXT_SUBSTMT_REVISIONDATE, 0, module->imp[i].rev,
                              module, module->imp[i].ext, module->imp[i].ext_size);
        }
        yin_print_substmt(out, level, LYEXT_SUBSTMT_DESCRIPTION, 0, module->imp[i].dsc,
                          module, module->imp[i].ext, module->imp[i].ext_size);
        yin_print_substmt(out, level, LYEXT_SUBSTMT_REFERENCE, 0, module->imp[i].ref,
                          module, module->imp[i].ext, module->imp[i].ext_size);

        level--;
        yin_print_close(out, level, NULL, "import", 1);
    }
    for (i = 0; i < module->inc_size; i++) {
        if (module->inc[i].rev[0] || module->inc[i].dsc || module->inc[i].ref || module->inc[i].ext_size) {
            yin_print_open(out, level, NULL, "include", "module", module->inc[i].submodule->name, 1);
            level++;

            yin_print_extension_instances(out, level, module, LYEXT_SUBSTMT_SELF, 0,
                                          module->inc[i].ext, module->inc[i].ext_size);
            if (module->inc[i].rev[0]) {
                yin_print_substmt(out, level, LYEXT_SUBSTMT_REVISIONDATE, 0, module->inc[i].rev,
                                  module, module->inc[i].ext, module->inc[i].ext_size);
            }
            yin_print_substmt(out, level, LYEXT_SUBSTMT_DESCRIPTION, 0, module->inc[i].dsc,
                               module, module->inc[i].ext, module->inc[i].ext_size);
            yin_print_substmt(out, level, LYEXT_SUBSTMT_REFERENCE, 0, module->inc[i].ref,
                              module, module->inc[i].ext, module->inc[i].ext_size);

            level--;
            yin_print_close(out, level, NULL, "include", 1);
        } else {
            yin_print_open(out, level, NULL, "include", "module", module->inc[i].submodule->name, -1);
        }
    }

    /* meta-stmts */
    yin_print_substmt(out, level, LYEXT_SUBSTMT_ORGANIZATION, 0, module->org,
                      module, module->ext, module->ext_size);
    yin_print_substmt(out, level, LYEXT_SUBSTMT_CONTACT, 0, module->contact,
                      module, module->ext, module->ext_size);
    yin_print_substmt(out, level, LYEXT_SUBSTMT_DESCRIPTION, 0, module->dsc,
                      module, module->ext, module->ext_size);
    yin_print_substmt(out, level, LYEXT_SUBSTMT_REFERENCE, 0, module->ref,
                      module, module->ext, module->ext_size);

    /* revision-stmts */
    for (i = 0; i < module->rev_size; i++) {
        yin_print_revision(out, level, module, &module->rev[i]);
    }

    /* body-stmts */
    for (i = 0; i < module->extensions_size; ++i) {
        yin_print_extension(out, level, &module->extensions[i]);
    }
    if (module->ext_size) {
        yin_print_extension_instances(out, level, module, LYEXT_SUBSTMT_SELF, 0, module->ext, module->ext_size);
    }

    for (i = 0; i < module->features_size; i++) {
        yin_print_feature(out, level, &module->features[i]);
    }

    for (i = 0; i < module->ident_size; i++) {
        yin_print_identity(out, level, &module->ident[i]);
    }

    for (i = 0; i < module->tpdf_size; i++) {
        yin_print_typedef(out, level, module, &module->tpdf[i]);
    }

    LY_TREE_FOR(lys_main_module(module)->data, node) {
        if (node->module != module) {
            /* data from submodules */
            continue;
        }
        yin_print_snode(out, level, node, LYS_GROUPING);
    }

    LY_TREE_FOR(lys_main_module(module)->data, node) {
        if (node->module != module) {
            /* data from submodules */
            continue;
        }
        yin_print_snode(out, level, node, LYS_CHOICE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST |
                        LYS_USES | LYS_ANYDATA);
    }

    for (i = 0; i < module->augment_size; i++) {
        yin_print_augment(out, level, module, &module->augment[i]);
    }

    LY_TREE_FOR(lys_main_module(module)->data, node) {
        if (node->module != module) {
            /* data from submodules */
            continue;
        }
        yin_print_snode(out, level, node, LYS_RPC | LYS_ACTION);
    }

    LY_TREE_FOR(lys_main_module(module)->data, node) {
        if (node->module != module) {
            /* data from submodules */
            continue;
        }
        yin_print_snode(out, level, node, LYS_NOTIF);
    }

    for (i = 0; i < module->deviation_size; ++i) {
        yin_print_deviation(out, level, module, &module->deviation[i]);
    }

    level--;
    if (module->type) {
        ly_print(out, "%*s</submodule>\n", LEVEL, INDENT);
    } else {
        ly_print(out, "%*s</module>\n", LEVEL, INDENT);
    }
    ly_print_flush(out);

    return EXIT_SUCCESS;
}